

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_report_handler.cpp
# Opt level: O0

int sc_core::sc_report_handler::stop_after(char *msg_type_,sc_severity severity_,int limit)

{
  uint uVar1;
  sc_msg_def *psVar2;
  uint in_EDX;
  uint in_ESI;
  int old;
  int mask;
  sc_msg_def *md;
  uint local_24;
  char *in_stack_ffffffffffffffe8;
  
  psVar2 = mdlookup(in_stack_ffffffffffffffe8);
  if (psVar2 == (sc_msg_def *)0x0) {
    psVar2 = add_msg_type(_old);
  }
  uVar1 = 1 << ((char)in_ESI + 1U & 0x1f);
  if ((psVar2->limit_mask & uVar1) == 0) {
    local_24 = 0xffffffff;
  }
  else {
    local_24 = psVar2->sev_limit[in_ESI];
  }
  if ((int)in_EDX < 0) {
    psVar2->limit_mask = (uVar1 ^ 0xffffffff) & psVar2->limit_mask;
  }
  else {
    psVar2->limit_mask = uVar1 | psVar2->limit_mask;
    psVar2->sev_limit[in_ESI] = in_EDX;
  }
  return local_24;
}

Assistant:

int sc_report_handler::stop_after(const char * msg_type_,
				  sc_severity severity_,
				  int limit)
{
    sc_msg_def * md = mdlookup(msg_type_);

    if ( !md )
	md = add_msg_type(msg_type_);

    int mask = 1 << (severity_ + 1);
    int old = md->limit_mask & mask ?  md->sev_limit[severity_]: UINT_MAX;

    if ( limit < 0 )
	md->limit_mask &= ~mask;
    else
    {
	md->limit_mask |= mask;
	md->sev_limit[severity_] = limit;
    }
    return old;
}